

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderExecUtil::FragmentOutExecutor::execute
          (FragmentOutExecutor *this,int numValues,void **inputs,void **outputs)

{
  DataType dataType;
  uint uVar1;
  float *data;
  pointer ppSVar2;
  RenderContext *pRVar3;
  void *__dest;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  deUint32 dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  ulong uVar15;
  long lVar16;
  TextureFormat TVar17;
  ulong uVar18;
  mapped_type_conflict *pmVar19;
  NotSupportedError *this_00;
  TestError *this_01;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  pointer key;
  int height;
  uint uVar25;
  int outNdx;
  pointer pSVar26;
  undefined1 auVar27 [16];
  float in_XMM3_Db;
  undefined1 auVar28 [16];
  float in_XMM4_Db;
  TextureFormat readFormat;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  int value;
  ChannelType CStack_124;
  IndexType local_120;
  int iStack_11c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [4];
  string attribName;
  void *local_b8;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  Framebuffer framebuffer;
  RenderbufferVector renderbuffers;
  long lVar14;
  
  iVar5 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar5);
  uVar6 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[2])();
  value = 0;
  (**(code **)(lVar14 + 0x868))(0x84e8,&value);
  iVar7 = value;
  iVar5 = numValues;
  if (value < numValues) {
    iVar5 = value;
  }
  height = (numValues / iVar5 + 1) - (uint)(numValues % iVar5 == 0);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            (&framebuffer,(this->super_ShaderExecutor).m_renderCtx);
  glu::TypedObjectVector<(glu::ObjectType)2>::TypedObjectVector
            (&renderbuffers,(this->super_ShaderExecutor).m_renderCtx,
             (long)(this->m_outputLayout).locationSymbols.
                   super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_outputLayout).locationSymbols.
                   super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&positions,(long)numValues,(allocator_type *)&value);
  if (iVar7 < height) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"Value count is too high for maximum supported renderbuffer size",
               (allocator<char> *)&attribName);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)&value);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  auVar27._0_4_ = (float)iVar5;
  auVar27._4_4_ = (float)height;
  auVar27._8_8_ = 0;
  uVar21 = 0;
  uVar15 = 0;
  if (0 < numValues) {
    uVar15 = (ulong)(uint)numValues;
  }
  for (; uVar15 != uVar21; uVar21 = uVar21 + 1) {
    uVar18 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
    auVar28._0_4_ = (float)(int)((long)uVar18 % (long)iVar5) + 0.5;
    auVar28._4_4_ = (float)(int)((long)uVar18 / (long)iVar5) + 0.5;
    auVar28._8_4_ = in_XMM3_Db + 0.0;
    auVar28._12_4_ = in_XMM4_Db + 0.0;
    auVar28 = divps(auVar28,auVar27);
    in_XMM3_Db = auVar28._4_4_ + auVar28._4_4_ + -1.0;
    positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar21].m_data[0] =
         auVar28._0_4_ + auVar28._0_4_ + -1.0;
    positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar21].m_data[1] = in_XMM3_Db;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&attribName,"a_position",(allocator<char> *)&readFormat);
  glu::va::Float((VertexArrayBinding *)&value,&attribName,2,numValues,0,
                 (positions.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)&value);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&attribName);
  lVar24 = 0;
  do {
    pSVar26 = (this->super_ShaderExecutor).m_inputs.
              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar16 = (long)(this->super_ShaderExecutor).m_inputs.
                   super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar26;
    if ((int)(lVar16 / 0x38) <= lVar24) {
      (**(code **)(lVar14 + 0x78))(0x8d40,framebuffer.super_ObjectWrapper.m_object,lVar16 % 0x38);
      for (lVar24 = 0;
          ppSVar2 = (this->m_outputLayout).locationSymbols.
                    super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar24 < (int)((ulong)((long)(this->m_outputLayout).locationSymbols.
                                       super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2)
                        >> 3); lVar24 = lVar24 + 1) {
        uVar1 = renderbuffers.super_ObjectVector.m_objects.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar24];
        TVar17 = getRenderbufferFormatForOutput(&ppSVar2[lVar24]->varType,(uVar6 & 0x300) != 0x100);
        dVar9 = glu::getInternalFormat(TVar17);
        (**(code **)(lVar14 + 0xa0))(0x8d41,uVar1);
        (**(code **)(lVar14 + 0x1238))(0x8d41,dVar9,iVar5,height);
        (**(code **)(lVar14 + 0x688))(0x8d40,(int)lVar24 + 0x8ce0,0x8d41,uVar1);
      }
      (**(code **)(lVar14 + 0xa0))(0x8d41,0);
      dVar9 = (**(code **)(lVar14 + 0x800))();
      glu::checkError(dVar9,"Failed to set up framebuffer object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x27e);
      iVar7 = (**(code **)(lVar14 + 0x170))(0x8d40);
      if (iVar7 != 0x8cd5) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,
                   "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                   ,0x27f);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&value,
                 (long)(this->m_outputLayout).locationSymbols.
                       super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_outputLayout).locationSymbols.
                       super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&attribName)
      ;
      uVar18 = (ulong)((long)(this->m_outputLayout).locationSymbols.
                             super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_outputLayout).locationSymbols.
                            super__Vector_base<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3;
      uVar22 = 0;
      uVar21 = uVar18 & 0xffffffff;
      if ((int)uVar18 < 1) {
        uVar21 = uVar22;
      }
      for (; uVar21 != uVar22; uVar22 = uVar22 + 1) {
        *(int *)(CONCAT44(CStack_124,value) + uVar22 * 4) = (int)uVar22 + 0x8ce0;
      }
      (**(code **)(lVar14 + 0x560))
                ((ulong)(CONCAT44(iStack_11c,local_120) - CONCAT44(CStack_124,value)) >> 2);
      dVar9 = (**(code **)(lVar14 + 0x800))();
      glu::checkError(dVar9,"glDrawBuffers()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x286);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&value);
      (**(code **)(lVar14 + 0x1a00))(0,0,iVar5,height);
      pRVar3 = (this->super_ShaderExecutor).m_renderCtx;
      dVar9 = (*(this->super_ShaderExecutor)._vptr_ShaderExecutor[4])(this);
      value = 6;
      local_120 = INDEXTYPE_LAST;
      local_118[0]._M_allocated_capacity = (pointer)0x0;
      CStack_124 = numValues;
      glu::draw(pRVar3,dVar9,
                (int)(((long)vertexArrays.
                             super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vertexArrays.
                            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x50),
                vertexArrays.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)&value,
                (DrawUtilCallback *)0x0);
      dVar9 = (**(code **)(lVar14 + 0x800))();
      glu::checkError(dVar9,"Error in draw",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x28d);
      tcu::TextureLevel::TextureLevel((TextureLevel *)&value);
      for (lVar24 = 0;
          pSVar26 = (this->super_ShaderExecutor).m_outputs.
                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar24 < (int)(((long)(this->super_ShaderExecutor).m_outputs.
                                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar26) / 0x38);
          lVar24 = lVar24 + 1) {
        iVar10 = glu::VarType::getScalarSize(&pSVar26[lVar24].varType);
        key = pSVar26 + lVar24;
        iVar11 = glu::getDataTypeNumComponents((key->varType).m_data.basic.type);
        iVar12 = glu::getDataTypeNumLocations((key->varType).m_data.basic.type);
        __dest = outputs[lVar24];
        TVar17 = getRenderbufferFormatForOutput(&pSVar26[lVar24].varType,(uVar6 & 0x300) != 0x100);
        readFormat.order = RGBA;
        readFormat.type = TVar17.type;
        pmVar19 = de::
                  lookup<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                            (&(this->m_outputLayout).locationMap,&key->name);
        iVar7 = *pmVar19;
        tcu::TextureLevel::setStorage((TextureLevel *)&value,&readFormat,iVar5,height,1);
        bVar4 = iVar12 == 1;
        iVar13 = 0;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        for (iVar20 = 0; iVar20 != iVar12; iVar20 = iVar20 + 1) {
          (**(code **)(lVar14 + 0x1218))(iVar7 + 0x8ce0 + iVar20);
          pRVar3 = (this->super_ShaderExecutor).m_renderCtx;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)&attribName,(TextureLevel *)&value);
          glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)&attribName);
          dVar9 = (**(code **)(lVar14 + 0x800))();
          glu::checkError(dVar9,"Reading pixels",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                          ,0x2a6);
          if (bVar4 && iVar10 == 4) {
            tcu::TextureLevel::getAccess((PixelBufferAccess *)&attribName,(TextureLevel *)&value);
            memcpy(__dest,local_b8,(long)(iVar11 * numValues) << 2);
          }
          else {
            iVar23 = iVar13;
            for (lVar16 = 0; uVar15 << 2 != lVar16; lVar16 = lVar16 + 4) {
              tcu::TextureLevel::getAccess((PixelBufferAccess *)&attribName,(TextureLevel *)&value);
              memcpy((void *)((long)__dest + (long)iVar23 * 4),
                     (void *)((long)(int)lVar16 * 4 + (long)local_b8),(long)iVar11 * 4);
              iVar23 = iVar23 + iVar10;
            }
          }
          iVar13 = iVar13 + iVar11;
        }
      }
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&value);
      (**(code **)(lVar14 + 0x78))(0x8d40,0);
      std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
      ~_Vector_base(&positions.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   );
      std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                (&vertexArrays);
      glu::ObjectVector::~ObjectVector(&renderbuffers.super_ObjectVector);
      glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
      return;
    }
    pSVar26 = pSVar26 + lVar24;
    std::operator+(&attribName,"a_",&pSVar26->name);
    data = (float *)inputs[lVar24];
    dataType = (pSVar26->varType).m_data.basic.type;
    iVar7 = glu::getDataTypeScalarSize(dataType);
    if (dataType - TYPE_FLOAT < 4) {
      glu::va::Float((VertexArrayBinding *)&value,&attribName,iVar7,numValues,0,data);
      std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
      emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)&value);
LAB_01502c46:
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      if (dataType - TYPE_INT < 4) {
        glu::va::Int32((VertexArrayBinding *)&value,&attribName,iVar7,numValues,0,(deInt32 *)data);
        std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
        emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)&value);
        goto LAB_01502c46;
      }
      if (dataType - TYPE_UINT < 4) {
        glu::va::Uint32((VertexArrayBinding *)&value,&attribName,iVar7,numValues,0,(deUint32 *)data)
        ;
        std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
        emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)&value);
        goto LAB_01502c46;
      }
      if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
        iVar7 = glu::getDataTypeMatrixNumRows(dataType);
        uVar8 = glu::getDataTypeMatrixNumColumns(dataType);
        uVar25 = 0;
        uVar1 = uVar8;
        if ((int)uVar8 < 1) {
          uVar1 = uVar25;
        }
        for (uVar21 = 0; uVar1 != uVar21; uVar21 = uVar21 + 1) {
          glu::va::Float((VertexArrayBinding *)&value,&attribName,(int)uVar21,iVar7,numValues,
                         iVar7 * uVar8 * 4,data + (int)uVar25);
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
          emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)&value);
          std::__cxx11::string::~string((string *)&local_120);
          uVar25 = uVar25 + iVar7;
        }
      }
    }
    std::__cxx11::string::~string((string *)&attribName);
    lVar24 = lVar24 + 1;
  } while( true );
}

Assistant:

void FragmentOutExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&			gl					= m_renderCtx.getFunctions();
	const bool						useIntOutputs		= !hasFloatRenderTargets(m_renderCtx);
	const int						maxRenderbufferSize	= queryInt(gl, GL_MAX_RENDERBUFFER_SIZE);
	const int						framebufferW		= de::min(maxRenderbufferSize, numValues);
	const int						framebufferH		= (numValues / framebufferW) + ((numValues % framebufferW != 0) ? 1 : 0);

	glu::Framebuffer				framebuffer			(m_renderCtx);
	glu::RenderbufferVector			renderbuffers		(m_renderCtx, m_outputLayout.locationSymbols.size());

	vector<glu::VertexArrayBinding>	vertexArrays;
	vector<tcu::Vec2>				positions			(numValues);

	if (framebufferH > maxRenderbufferSize)
		throw tcu::NotSupportedError("Value count is too high for maximum supported renderbuffer size");

	// Compute positions - 1px points are used to drive fragment shading.
	for (int valNdx = 0; valNdx < numValues; valNdx++)
	{
		const int		ix		= valNdx % framebufferW;
		const int		iy		= valNdx / framebufferW;
		const float		fx		= -1.0f + 2.0f*((float(ix) + 0.5f) / float(framebufferW));
		const float		fy		= -1.0f + 2.0f*((float(iy) + 0.5f) / float(framebufferH));

		positions[valNdx] = tcu::Vec2(fx, fy);
	}

	// Vertex inputs.
	vertexArrays.push_back(glu::va::Float("a_position", 2, numValues, 0, (const float*)&positions[0]));

	for (int inputNdx = 0; inputNdx < (int)m_inputs.size(); inputNdx++)
	{
		const Symbol&		symbol		= m_inputs[inputNdx];
		const std::string	attribName	= "a_" + symbol.name;
		const void*			ptr			= inputs[inputNdx];
		const glu::DataType	basicType	= symbol.varType.getBasicType();
		const int			vecSize		= glu::getDataTypeScalarSize(basicType);

		if (glu::isDataTypeFloatOrVec(basicType))
			vertexArrays.push_back(glu::va::Float(attribName, vecSize, numValues, 0, (const float*)ptr));
		else if (glu::isDataTypeIntOrIVec(basicType))
			vertexArrays.push_back(glu::va::Int32(attribName, vecSize, numValues, 0, (const deInt32*)ptr));
		else if (glu::isDataTypeUintOrUVec(basicType))
			vertexArrays.push_back(glu::va::Uint32(attribName, vecSize, numValues, 0, (const deUint32*)ptr));
		else if (glu::isDataTypeMatrix(basicType))
		{
			int		numRows	= glu::getDataTypeMatrixNumRows(basicType);
			int		numCols	= glu::getDataTypeMatrixNumColumns(basicType);
			int		stride	= numRows * numCols * (int)sizeof(float);

			for (int colNdx = 0; colNdx < numCols; ++colNdx)
				vertexArrays.push_back(glu::va::Float(attribName, colNdx, numRows, numValues, stride, ((const float*)ptr) + colNdx * numRows));
		}
		else
			DE_ASSERT(false);
	}

	// Construct framebuffer.
	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);

	for (int outNdx = 0; outNdx < (int)m_outputLayout.locationSymbols.size(); ++outNdx)
	{
		const Symbol&	output			= *m_outputLayout.locationSymbols[outNdx];
		const deUint32	renderbuffer	= renderbuffers[outNdx];
		const deUint32	format			= glu::getInternalFormat(getRenderbufferFormatForOutput(output.varType, useIntOutputs));

		gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffer);
		gl.renderbufferStorage(GL_RENDERBUFFER, format, framebufferW, framebufferH);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0+outNdx, GL_RENDERBUFFER, renderbuffer);
	}
	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set up framebuffer object");
	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	{
		vector<deUint32> drawBuffers(m_outputLayout.locationSymbols.size());
		for (int ndx = 0; ndx < (int)m_outputLayout.locationSymbols.size(); ndx++)
			drawBuffers[ndx] = GL_COLOR_ATTACHMENT0+ndx;
		gl.drawBuffers((int)drawBuffers.size(), &drawBuffers[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffers()");
	}

	// Render
	gl.viewport(0, 0, framebufferW, framebufferH);
	glu::draw(m_renderCtx, this->getProgram(), (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Points(numValues));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error in draw");

	// Read back pixels.
	{
		tcu::TextureLevel	tmpBuf;

		// \todo [2013-08-07 pyry] Some fast-paths could be added here.

		for (int outNdx = 0; outNdx < (int)m_outputs.size(); ++outNdx)
		{
			const Symbol&				output			= m_outputs[outNdx];
			const int					outSize			= output.varType.getScalarSize();
			const int					outVecSize		= glu::getDataTypeNumComponents(output.varType.getBasicType());
			const int					outNumLocs		= glu::getDataTypeNumLocations(output.varType.getBasicType());
			deUint32*					dstPtrBase		= static_cast<deUint32*>(outputs[outNdx]);
			const tcu::TextureFormat	format			= getRenderbufferFormatForOutput(output.varType, useIntOutputs);
			const tcu::TextureFormat	readFormat		(tcu::TextureFormat::RGBA, format.type);
			const int					outLocation		= de::lookup(m_outputLayout.locationMap, output.name);

			tmpBuf.setStorage(readFormat, framebufferW, framebufferH);

			for (int locNdx = 0; locNdx < outNumLocs; ++locNdx)
			{
				gl.readBuffer(GL_COLOR_ATTACHMENT0 + outLocation + locNdx);
				glu::readPixels(m_renderCtx, 0, 0, tmpBuf.getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels");

				if (outSize == 4 && outNumLocs == 1)
					deMemcpy(dstPtrBase, tmpBuf.getAccess().getDataPtr(), numValues*outVecSize*sizeof(deUint32));
				else
				{
					for (int valNdx = 0; valNdx < numValues; valNdx++)
					{
						const deUint32* srcPtr = (const deUint32*)tmpBuf.getAccess().getDataPtr() + valNdx*4;
						deUint32*		dstPtr = &dstPtrBase[outSize*valNdx + outVecSize*locNdx];
						deMemcpy(dstPtr, srcPtr, outVecSize*sizeof(deUint32));
					}
				}
			}
		}
	}

	// \todo [2013-08-07 pyry] Clear draw buffers & viewport?
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}